

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_mul_int(secp256k1_fe *r,int a)

{
  int a_local;
  secp256k1_fe *r_local;
  
  r->n[0] = (long)a * r->n[0];
  r->n[1] = (long)a * r->n[1];
  r->n[2] = (long)a * r->n[2];
  r->n[3] = (long)a * r->n[3];
  r->n[4] = (long)a * r->n[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int(secp256k1_fe *r, int a) {
    r->n[0] *= a;
    r->n[1] *= a;
    r->n[2] *= a;
    r->n[3] *= a;
    r->n[4] *= a;
#ifdef VERIFY
    r->magnitude *= a;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}